

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O3

bool __thiscall OSSLDSA::verifyFinal(OSSLDSA *this,ByteString *signature)

{
  OSSLDSAPublicKey *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  DSA_SIG *a;
  uchar *puVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  DSA *dsa;
  ulong uVar8;
  ByteString hash;
  ByteString local_58;
  
  this_00 = (OSSLDSAPublicKey *)(this->super_AsymmetricAlgorithm).currentPublicKey;
  bVar1 = AsymmetricAlgorithm::verifyFinal(&this->super_AsymmetricAlgorithm,signature);
  if (!bVar1) {
    return false;
  }
  ByteString::ByteString(&local_58);
  iVar2 = (*this->pCurrentHash->_vptr_HashAlgorithm[4])(this->pCurrentHash,&local_58);
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  this->pCurrentHash = (HashAlgorithm *)0x0;
  if ((char)iVar2 != '\0') {
    uVar3 = (**(code **)(*(long *)&this_00->super_DSAPublicKey + 0x28))(this_00);
    sVar4 = ByteString::size(signature);
    if ((sVar4 == uVar3) && (a = DSA_SIG_new(), a != (DSA_SIG *)0x0)) {
      puVar5 = ByteString::const_byte_str(signature);
      uVar3 = uVar3 >> 1;
      pBVar6 = BN_bin2bn(puVar5,uVar3,(BIGNUM *)0x0);
      pBVar7 = BN_bin2bn(puVar5 + uVar3,uVar3,(BIGNUM *)0x0);
      if ((pBVar7 == (BIGNUM *)0x0 || pBVar6 == (BIGNUM *)0x0) ||
         (iVar2 = DSA_SIG_set0(a,pBVar6,pBVar7), iVar2 == 0)) {
        DSA_SIG_free(a);
      }
      else {
        puVar5 = ByteString::operator[](&local_58,0);
        sVar4 = ByteString::size(&local_58);
        dsa = (DSA *)OSSLDSAPublicKey::getOSSLKey(this_00);
        iVar2 = DSA_do_verify(puVar5,(int)sVar4,a,dsa);
        if (iVar2 == 1) {
          bVar1 = true;
          DSA_SIG_free(a);
          goto LAB_00154003;
        }
        if (iVar2 < 0) {
          uVar8 = ERR_get_error();
          softHSMLog(3,"verifyFinal",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLDSA.cpp"
                     ,0x1ac,"DSA verify failed (0x%08X)",uVar8);
        }
        DSA_SIG_free(a);
      }
    }
  }
  bVar1 = false;
LAB_00154003:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar1;
}

Assistant:

bool OSSLDSA::verifyFinal(const ByteString& signature)
{
	// Save necessary state before calling super class verifyFinal
	OSSLDSAPublicKey* pk = (OSSLDSAPublicKey*) currentPublicKey;

	if (!AsymmetricAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString hash;

	bool bFirstResult = pCurrentHash->hashFinal(hash);

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (!bFirstResult)
	{
		return false;
	}

	// Perform the verify operation
	unsigned int sigLen = pk->getOutputLength();
	if (signature.size() != sigLen)
		return false;
	DSA_SIG* sig = DSA_SIG_new();
	if (sig == NULL)
		return false;
	const unsigned char *s = signature.const_byte_str();
	BIGNUM* bn_r = BN_bin2bn(s, sigLen / 2, NULL);
	BIGNUM* bn_s = BN_bin2bn(s + sigLen / 2, sigLen / 2, NULL);
	if (bn_r == NULL || bn_s == NULL ||
	    !DSA_SIG_set0(sig, bn_r, bn_s))
	{
		DSA_SIG_free(sig);
		return false;
	}
	int ret = DSA_do_verify(&hash[0], hash.size(), sig, pk->getOSSLKey());
	if (ret != 1)
	{
		if (ret < 0)
			ERROR_MSG("DSA verify failed (0x%08X)", ERR_get_error());

		DSA_SIG_free(sig);
		return false;
	}

	DSA_SIG_free(sig);
	return true;
}